

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

void cpsm::str_cat_impl<char_const*,unsigned_long>(stringstream *ss,char **x,unsigned_long args)

{
  std::operator<<((ostream *)(ss + 0x10),*x);
  std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}